

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-util.c
# Opt level: O0

int borg_panel_hgt(void)

{
  int local_10;
  int local_c;
  int panel_hgt;
  
  if (Term == angband_term[0]) {
    local_c = ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode]) /
              (int)(uint)tile_height;
  }
  else {
    local_c = Term->hgt / (int)(uint)tile_height;
  }
  if (local_c < 1) {
    local_10 = 1;
  }
  else {
    local_10 = local_c;
  }
  return local_10;
}

Assistant:

int borg_panel_hgt(void)
{
    int panel_hgt;

    /* Use dimensions that match those in ui-output.c. */
    if (Term == term_screen) {
        panel_hgt = SCREEN_HGT;
    } else {
        panel_hgt = Term->hgt / tile_height;
    }
    /* Bound below to avoid division by zero. */
    return MAX(panel_hgt, 1);
}